

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::DeleteBorderRoutersInDomain
          (Registry *this,string *aDomainName)

{
  pointer puVar1;
  char cVar2;
  Status SVar3;
  bool bVar4;
  int iVar5;
  unsigned_long *xpan;
  pointer puVar6;
  DomainArray doms;
  StringArray aUnresolved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> xpans;
  StringArray aAliases;
  Domain currentDomain;
  Domain dom;
  Network current;
  
  Domain::Domain(&dom);
  doms.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  doms.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  doms.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Network::Network(&current);
  xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aAliases.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  aAliases.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  aAliases.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aUnresolved.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  aUnresolved.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  aUnresolved.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)&dom.mName);
  iVar5 = (*this->mStorage->_vptr_PersistentStorage[0x15])(this->mStorage,&dom,&doms);
  cVar2 = (char)iVar5;
  SVar3 = (cVar2 != '\0') << 2;
  if (cVar2 == '\x01') {
    SVar3 = kNotFound;
  }
  if (((cVar2 == '\0') &&
      (SVar3 = kError,
      (long)doms.
            super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)doms.
            super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x28)) &&
     (SVar3 = GetCurrentNetwork(this,&current), SVar3 == kSuccess)) {
    if (current.mDomainId.mId != 0xffffffff) {
      Domain::Domain(&currentDomain);
      iVar5 = (*this->mStorage->_vptr_PersistentStorage[0xd])
                        (this->mStorage,&current.mDomainId,&currentDomain);
      cVar2 = (char)iVar5;
      SVar3 = (cVar2 != '\0') << 2;
      if (cVar2 == '\x01') {
        SVar3 = kNotFound;
      }
      if (cVar2 == '\0') {
        bVar4 = std::operator!=(&currentDomain.mName,aDomainName);
        SVar3 = !bVar4 * '\x05';
      }
      else {
        bVar4 = false;
      }
      std::__cxx11::string::~string((string *)&currentDomain.mName);
      if (bVar4 == false) goto LAB_001616af;
    }
    SVar3 = GetNetworkXpansInDomain(this,aDomainName,&xpans);
    puVar1 = xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (SVar3 == kSuccess) {
      if (xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start ==
          xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        iVar5 = (*this->mStorage->_vptr_PersistentStorage[9])
                          (this->mStorage,
                           doms.
                           super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        SVar3 = ((char)iVar5 != '\0') << 2;
        if ((char)iVar5 == '\x01') {
          SVar3 = kNotFound;
        }
      }
      else {
        for (puVar6 = xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1;
            puVar6 = puVar6 + 1) {
          utils::Hex<unsigned_long>((string *)&currentDomain,*puVar6);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&aAliases,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &currentDomain);
          std::__cxx11::string::~string((string *)&currentDomain);
        }
        SVar3 = DeleteBorderRoutersInNetworks(this,&aAliases,&aUnresolved);
        if (SVar3 == kSuccess) {
          SVar3 = (aUnresolved.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                  aUnresolved.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) * '\x03';
        }
      }
    }
  }
LAB_001616af:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&aUnresolved);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&aAliases);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&xpans.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  Network::~Network(&current);
  std::
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ::~vector(&doms);
  std::__cxx11::string::~string((string *)&dom.mName);
  return SVar3;
}

Assistant:

Registry::Status Registry::DeleteBorderRoutersInDomain(const std::string &aDomainName)
{
    Domain                dom;
    DomainArray           doms;
    Registry::Status      status;
    Network               current;
    std::vector<uint64_t> xpans;
    StringArray           aAliases;
    StringArray           aUnresolved;

    dom.mName = aDomainName;
    VerifyOrExit((status = MapStatus(mStorage->Lookup(dom, doms))) == Registry::Status::kSuccess);
    VerifyOrExit(doms.size() == 1, status = Registry::Status::kError);

    VerifyOrExit((status = GetCurrentNetwork(current)) == Registry::Status::kSuccess);
    if (current.mDomainId.mId != EMPTY_ID)
    {
        Domain currentDomain;
        VerifyOrExit((status = MapStatus(mStorage->Get(current.mDomainId, currentDomain))) ==
                     Registry::Status::kSuccess);
        VerifyOrExit(currentDomain.mName != aDomainName, status = Registry::Status::kRestricted);
    }

    VerifyOrExit((status = GetNetworkXpansInDomain(aDomainName, xpans)) == Registry::Status::kSuccess);
    VerifyOrExit(!xpans.empty(), status = MapStatus(mStorage->Del(doms[0].mId)));

    for (auto &&xpan : xpans)
    {
        aAliases.push_back(utils::Hex(xpan));
    }
    VerifyOrExit((status = DeleteBorderRoutersInNetworks(aAliases, aUnresolved)) == Registry::Status::kSuccess);
    VerifyOrExit(aUnresolved.empty(), status = Registry::Status::kAmbiguity);
    // Domain will be deleted
exit:
    return status;
}